

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O3

void PrintFunction(InstructionRegVmLowerGraphContext *ctx,RegVmLoweredModule *lowModule,
                  RegVmLoweredFunction *lowFunction)

{
  VmValueType VVar1;
  FunctionData *pFVar2;
  ArgumentData *pAVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ScopeData *pSVar8;
  VariableData *pVVar9;
  char *pcVar10;
  VmConstant *pVVar11;
  VmValue *pVVar12;
  VmConstant *pVVar13;
  ModuleData *pMVar14;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  char *pcVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  bool bVar24;
  ulong uVar25;
  
  pFVar2 = lowFunction->vmFunction->function;
  if (pFVar2 == (FunctionData *)0x0) {
    PrintLine(ctx->output,"function global()");
  }
  else {
    pcVar18 = (pFVar2->name->name).begin;
    Print(ctx->output,"function %.*s.f%04x(",
          (ulong)(uint)(*(int *)&(pFVar2->name->name).end - (int)pcVar18),pcVar18,
          (ulong)pFVar2->uniqueId);
    if ((pFVar2->arguments).count != 0) {
      lVar20 = 0;
      uVar25 = 0;
      do {
        pAVar3 = (pFVar2->arguments).data;
        pcVar18 = ", ";
        if (lVar20 == 0) {
          pcVar18 = "";
        }
        pcVar17 = "";
        if ((&pAVar3->isExplicit)[lVar20] != false) {
          pcVar17 = "explicit ";
        }
        lVar4 = *(long *)((long)&pAVar3->name + lVar20);
        lVar5 = *(long *)((long)&pAVar3->type + lVar20);
        uVar6 = *(undefined8 *)(lVar5 + 0x10);
        uVar7 = *(undefined8 *)(lVar4 + 0x40);
        Print(ctx->output,"%s%s%.*s %.*s",pcVar18,pcVar17,
              (ulong)(uint)(*(int *)(lVar5 + 0x18) - (int)uVar6),uVar6,
              (ulong)(uint)(*(int *)(lVar4 + 0x48) - (int)uVar7),uVar7);
        uVar25 = uVar25 + 1;
        lVar20 = lVar20 + 0x30;
      } while (uVar25 < (pFVar2->arguments).count);
    }
    PrintLine(ctx->output,")");
    PrintLine(ctx->output,"// argument size %lld",pFVar2->argumentsSize);
    PrintLine(ctx->output,"// stack size %lld",pFVar2->stackSize);
    uVar15 = pFVar2->vmFunction->regVmRegisters;
    PrintLine(ctx->output,"// register count %d (r0-r%d)",(ulong)uVar15,(ulong)(uVar15 - 1));
  }
  pSVar8 = lowFunction->vmFunction->scope;
  if ((pSVar8 != (ScopeData *)0x0) && (uVar15 = (pSVar8->allVariables).count, uVar15 != 0)) {
    uVar25 = 0;
    do {
      pVVar9 = (pSVar8->allVariables).data[uVar25];
      if ((pVVar9->isAlloca != true) || ((pVVar9->users).count != 0)) {
        pcVar18 = "imported ";
        if (pVVar9->importModule == (ModuleData *)0x0) {
          pcVar18 = "";
        }
        pcVar17 = (pVVar9->type->name).begin;
        pcVar10 = (pVVar9->name->name).begin;
        Print(ctx->output,"// %s0x%x: %.*s %.*s",pcVar18,(ulong)pVVar9->offset,
              (ulong)(uint)(*(int *)&(pVVar9->type->name).end - (int)pcVar17),pcVar17,
              (ulong)(uint)(*(int *)&(pVVar9->name->name).end - (int)pcVar10),pcVar10);
        uVar16 = (ulong)(pVVar9->users).count;
        if (uVar16 == 0) {
LAB_0026fe50:
          Print(ctx->output," noalias");
        }
        else {
          uVar19 = 0;
          bVar24 = false;
          do {
            pVVar11 = (pVVar9->users).data[uVar19];
            uVar21 = (ulong)(pVVar11->super_VmValue).users.count;
            if (uVar21 != 0) {
              uVar22 = 0;
              bVar23 = bVar24;
              do {
                pVVar12 = (pVVar11->super_VmValue).users.data[uVar22];
                if ((pVVar12 == (VmValue *)0x0) || (pVVar12->typeID != 2)) {
                  __assert_fail("!\"invalid constant use\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                                ,0x3a3,
                                "void PrintFunction(InstructionRegVmLowerGraphContext &, RegVmLoweredModule *, RegVmLoweredFunction *)"
                               );
                }
                uVar15 = *(uint *)&pVVar12[1]._vptr_VmValue;
                if (uVar15 < 7) {
LAB_0026fd76:
                  bVar24 = bVar23;
                }
                else if ((uVar15 - 8 < 7) || (uVar15 == 0x1a)) {
                  if (pVVar12[1].type.type == VM_TYPE_VOID) goto LAB_0026ff5c;
                  pVVar13 = (VmConstant *)**(long **)&pVVar12[1].typeID;
joined_r0x0026fddd:
                  bVar24 = true;
                  if (pVVar13 == pVVar11) goto LAB_0026fd76;
                }
                else {
                  if (uVar15 == 0x1b) {
                    VVar1 = pVVar12[1].type.type;
                    if (VVar1 == VM_TYPE_VOID) {
LAB_0026ff5c:
                      __assert_fail("index < count",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                                    ,0x199,
                                    "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                                   );
                    }
                    if ((VmConstant *)**(long **)&pVVar12[1].typeID == pVVar11) goto LAB_0026fd76;
                    if (VVar1 < VM_TYPE_LONG) goto LAB_0026ff5c;
                    pVVar13 = (VmConstant *)(*(long **)&pVVar12[1].typeID)[2];
                    goto joined_r0x0026fddd;
                  }
                  if (uVar15 - 0x1f < 2) {
                    bVar24 = true;
                    if (pVVar11->isReference != false) goto LAB_0026fd76;
                  }
                  else {
                    bVar24 = true;
                    if (uVar15 - 0x33 < 0x11) {
                      if (pVVar12[1].type.type < VM_TYPE_DOUBLE) goto LAB_0026ff5c;
                      pVVar13 = *(VmConstant **)(*(long *)&pVVar12[1].typeID + 8);
                      goto joined_r0x0026fddd;
                    }
                  }
                }
                uVar22 = uVar22 + 1;
                bVar23 = bVar24;
              } while (uVar21 != uVar22);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar16);
          if (!bVar24) goto LAB_0026fe50;
        }
        if (pVVar9->isAlloca == true) {
          Print(ctx->output," alloca");
        }
        pMVar14 = pVVar9->importModule;
        if (pMVar14 != (ModuleData *)0x0) {
          Print(ctx->output," from \'%.*s\'",
                (ulong)(uint)(*(int *)&(pMVar14->name).end - (int)(pMVar14->name).begin));
        }
        OutputContext::Print(ctx->output,"\n",1);
        uVar15 = (pSVar8->allVariables).count;
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 < uVar15);
  }
  PrintLine(ctx->output,"{");
  if ((lowFunction->blocks).count != 0) {
    uVar25 = 0;
    do {
      PrintBlock(ctx,lowModule,(lowFunction->blocks).data[uVar25]);
      uVar25 = uVar25 + 1;
    } while (uVar25 < (lowFunction->blocks).count);
  }
  PrintLine(ctx->output,"}");
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void PrintFunction(InstructionRegVmLowerGraphContext &ctx, RegVmLoweredModule *lowModule, RegVmLoweredFunction *lowFunction)
{
	if(FunctionData *fData = lowFunction->vmFunction->function)
	{
		Print(ctx.output, "function %.*s.f%04x(", FMT_ISTR(fData->name->name), fData->uniqueId);

		for(unsigned i = 0; i < fData->arguments.size(); i++)
		{
			ArgumentData &argument = fData->arguments[i];

			Print(ctx.output, "%s%s%.*s %.*s", i == 0 ? "" : ", ", argument.isExplicit ? "explicit " : "", FMT_ISTR(argument.type->name), FMT_ISTR(argument.name->name));
		}

		PrintLine(ctx.output, ")");

		PrintLine(ctx.output, "// argument size %lld", fData->argumentsSize);
		PrintLine(ctx.output, "// stack size %lld", fData->stackSize);
		PrintLine(ctx.output, "// register count %d (r0-r%d)", fData->vmFunction->regVmRegisters, fData->vmFunction->regVmRegisters - 1);
	}
	else
	{
		PrintLine(ctx.output, "function global()");
	}

	if(ScopeData *scope = lowFunction->vmFunction->scope)
	{
		for(unsigned i = 0; i < scope->allVariables.size(); i++)
		{
			VariableData *variable = scope->allVariables[i];

			if(variable->isAlloca && variable->users.empty())
				continue;

			Print(ctx.output, "// %s0x%x: %.*s %.*s", variable->importModule ? "imported " : "", variable->offset, FMT_ISTR(variable->type->name), FMT_ISTR(variable->name->name));

			bool addressTaken = false;

			for(unsigned i = 0; i < variable->users.size(); i++)
			{
				VmConstant *user = variable->users[i];

				for(unsigned k = 0; k < user->users.size(); k++)
				{
					if(VmInstruction *inst = getType<VmInstruction>(user->users[k]))
					{
						bool simpleUse = false;

						if(inst->cmd >= VM_INST_LOAD_BYTE && inst->cmd <= VM_INST_LOAD_STRUCT)
							simpleUse = true;
						else if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
							simpleUse = true;
						else if(inst->cmd == VM_INST_MEM_COPY && (inst->arguments[0] == user || inst->arguments[2] == user))
							simpleUse = true;
						else if(inst->cmd == VM_INST_SET_RANGE && inst->arguments[0] == user)
							simpleUse = true;
						else if((inst->cmd == VM_INST_RETURN || inst->cmd == VM_INST_CALL) && user->isReference)
							simpleUse = true;
						else if(inst->cmd >= VM_INST_ADD_LOAD && inst->cmd <= VM_INST_BIT_XOR_LOAD && inst->arguments[1] == user)
							simpleUse = true;
						else
							simpleUse = false;

						if(!simpleUse)
							addressTaken = true;
					}
					else
					{
						assert(!"invalid constant use");
					}
				}
			}

			if(!addressTaken)
				Print(ctx.output, " noalias");

			if(variable->isAlloca)
				Print(ctx.output, " alloca");

			if(variable->importModule)
				Print(ctx.output, " from '%.*s'", FMT_ISTR(variable->importModule->name));

			PrintLine(ctx.output);
		}
	}

	PrintLine(ctx.output, "{");

	for(unsigned i = 0; i < lowFunction->blocks.size(); i++)
		PrintBlock(ctx, lowModule, lowFunction->blocks[i]);

	PrintLine(ctx.output, "}");
	PrintLine(ctx.output);
}